

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerBrFncCachedScopeEq(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode branchOpCode;
  uint32 offset;
  undefined4 *puVar3;
  Opnd *pOVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *compareSrc1;
  BranchInstr *this_00;
  LabelInstr *target;
  IndirOpnd *indirOpnd;
  RegOpnd *src1Reg;
  OpCode opcode;
  Instr *instr_local;
  Lowerer *this_local;
  
  if ((instr->m_opcode != BrFncCachedScopeEq) && (instr->m_opcode != BrFncCachedScopeNeq)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c8a,
                       "(instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  branchOpCode = BrNeq_A;
  if (instr->m_opcode == BrFncCachedScopeEq) {
    branchOpCode = BrEq_A;
  }
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar4);
  offset = Js::ScriptFunction::GetOffsetOfCachedScopeObj();
  compareSrc1 = IR::IndirOpnd::New(baseOpnd,offset,TyInt64,this->m_func,false);
  pOVar4 = IR::Instr::UnlinkSrc2(instr);
  this_00 = IR::Instr::AsBranchInstr(instr);
  target = IR::BranchInstr::GetTarget(this_00);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,pOVar4,branchOpCode,false,target,instr->m_next,
                      false);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void Lowerer::LowerBrFncCachedScopeEq(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq);
    Js::OpCode opcode = (instr->m_opcode == Js::OpCode::BrFncCachedScopeEq ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A);

    IR::RegOpnd *src1Reg = instr->UnlinkSrc1()->AsRegOpnd();

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src1Reg, Js::ScriptFunction::GetOffsetOfCachedScopeObj(), TyMachReg, this->m_func);
    this->InsertCompareBranch(indirOpnd, instr->UnlinkSrc2(), opcode, false, instr->AsBranchInstr()->GetTarget(), instr->m_next);

    instr->Remove();
}